

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_expr.cc
# Opt level: O2

void __thiscall var_valid_check_Test::~var_valid_check_Test(var_valid_check_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(var, valid_check) {  // NOLINT
    Context context;
    auto &mod = context.generator("mod");

    EXPECT_THROW(context.generator("var"), UserException);
    EXPECT_THROW(mod.var("config", 1), UserException);
    EXPECT_THROW(mod.var("a", 0), UserException);
    EXPECT_THROW(Enum("var", {}, 1), UserException);
}